

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O0

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::lazy_generate_cu_cache(dwarf_resolver *this)

{
  iterator iVar1;
  iterator iVar2;
  anon_class_8_1_8991fb9c local_38;
  function<bool_(const_cpptrace::detail::libdwarf::die_object_&)> local_30;
  dwarf_resolver *local_10;
  dwarf_resolver *this_local;
  
  if ((this->generated_cu_cache & 1U) == 0) {
    local_38.this = this;
    local_10 = this;
    std::function<bool(cpptrace::detail::libdwarf::die_object_const&)>::
    function<cpptrace::detail::libdwarf::dwarf_resolver::lazy_generate_cu_cache()::_lambda(cpptrace::detail::libdwarf::die_object_const&)_1_,void>
              ((function<bool(cpptrace::detail::libdwarf::die_object_const&)> *)&local_30,&local_38)
    ;
    walk_compilation_units(this,&local_30);
    std::function<bool_(const_cpptrace::detail::libdwarf::die_object_&)>::~function(&local_30);
    iVar1 = std::
            vector<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>
            ::begin(&this->cu_cache);
    iVar2 = std::
            vector<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>
            ::end(&this->cu_cache);
    std::
    sort<__gnu_cxx::__normal_iterator<cpptrace::detail::libdwarf::cu_entry*,std::vector<cpptrace::detail::libdwarf::cu_entry,std::allocator<cpptrace::detail::libdwarf::cu_entry>>>,cpptrace::detail::libdwarf::dwarf_resolver::lazy_generate_cu_cache()::_lambda(cpptrace::detail::libdwarf::cu_entry_const&,cpptrace::detail::libdwarf::cu_entry_const&)_1_>
              (iVar1._M_current,iVar2._M_current);
    this->generated_cu_cache = true;
  }
  return;
}

Assistant:

void lazy_generate_cu_cache() {
            if(!generated_cu_cache) {
                walk_compilation_units([this] (const die_object& cu_die) {
                    Dwarf_Half offset_size = 0;
                    Dwarf_Half dwversion = 0;
                    dwarf_get_version_of_die(cu_die.get(), &dwversion, &offset_size);
                    if(skeleton) {
                        // NOTE: If we have a corresponding skeleton, we assume we have one CU matching the skeleton CU
                        // Precedence for this assumption is https://dwarfstd.org/doc/DWARF5.pdf#subsection.3.1.3
                        // TODO: Also assuming same dwversion
                        const auto& skeleton_cu = skeleton.unwrap().cu_die;
                        auto ranges_vec = skeleton_cu.get_rangelist_entries(skeleton_cu, dwversion);
                        for(auto range : ranges_vec) {
                            // TODO: Reduce cloning here
                            cu_cache.push_back({ cu_die.clone(), dwversion, range.first, range.second });
                        }
                        return false;
                    } else {
                        auto ranges_vec = cu_die.get_rangelist_entries(cu_die, dwversion);
                        for(auto range : ranges_vec) {
                            // TODO: Reduce cloning here
                            cu_cache.push_back({ cu_die.clone(), dwversion, range.first, range.second });
                        }
                        return true;
                    }
                });
                std::sort(cu_cache.begin(), cu_cache.end(), [] (const cu_entry& a, const cu_entry& b) {
                    return a.low < b.low;
                });
                generated_cu_cache = true;
            }
        }